

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_slider.c
# Opt level: O1

void slider_set(t_slider *x,t_floatarg f)

{
  double dVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  
  iVar2 = x->x_val;
  x->x_fval = f;
  dVar4 = x->x_min;
  dVar1 = x->x_max;
  if (dVar4 <= dVar1) {
    if (dVar1 < (double)f) {
      f = (t_floatarg)dVar1;
    }
    if ((double)f < dVar4) {
      f = (t_floatarg)dVar4;
    }
  }
  else {
    if (dVar4 < (double)f) {
      f = (t_floatarg)dVar4;
    }
    if ((double)f < dVar1) {
      f = (t_floatarg)dVar1;
    }
  }
  if (x->x_lin0_log1 == 0) {
    dVar4 = (double)f - dVar4;
  }
  else {
    dVar4 = log((double)f / dVar4);
  }
  iVar3 = (int)((dVar4 / x->x_k) * 100.0 + 0.49999);
  x->x_val = iVar3;
  if (iVar2 == iVar3) {
    return;
  }
  (*(x->x_gui).x_draw)(x,(x->x_gui).x_glist,0);
  return;
}

Assistant:

static void slider_set(t_slider *x, t_floatarg f)
{
    int old = x->x_val;
    double g;

    x->x_fval = f;
    if (x->x_min > x->x_max)
    {
        if(f > x->x_min)
            f = x->x_min;
        if(f < x->x_max)
            f = x->x_max;
    }
    else
    {
        if(f > x->x_max)
            f = x->x_max;
        if(f < x->x_min)
            f = x->x_min;
    }
    if(x->x_lin0_log1)
        g = log(f/x->x_min) / x->x_k;
    else
        g = (f - x->x_min) / x->x_k;
    x->x_val = (int)(100.0*g + 0.49999);
    if(x->x_val != old)
        (*x->x_gui.x_draw)(x, x->x_gui.x_glist, IEM_GUI_DRAW_MODE_UPDATE);
}